

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O1

vector<Range,_std::allocator<Range>_> *
getAllExclusions(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Rules *rules,
                Range *range)

{
  undefined8 uVar1;
  vector<Range,_std::allocator<Range>_> *pvVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  Exclusion *exclusion_1;
  pointer pRVar6;
  pointer pEVar7;
  Datetime *pDVar8;
  Datetime *pDVar9;
  char *__end;
  Range *r;
  Range *pRVar10;
  Exclusion *exclusion;
  Exclusion *this;
  byte bVar11;
  vector<Range,_std::allocator<Range>_> exclusionRanges;
  vector<Range,_std::allocator<Range>_> results;
  vector<Range,_std::allocator<Range>_> daysOn;
  vector<Range,_std::allocator<Range>_> daysOff;
  vector<Exclusion,_std::allocator<Exclusion>_> exclusions;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  vector<Range,_std::allocator<Range>_> local_c8;
  undefined1 local_a8 [32];
  vector<Range,_std::allocator<Range>_> local_88;
  Range *local_68;
  Rules *local_60;
  vector<Exclusion,_std::allocator<Exclusion>_> local_58;
  vector<Range,_std::allocator<Range>_> *local_38;
  
  bVar11 = 0;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Range *)0x0;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_60 = rules;
  local_38 = __return_storage_ptr__;
  getHolidays((vector<Range,_std::allocator<Range>_> *)local_a8,rules);
  local_68 = range;
  addRanges((vector<Range,_std::allocator<Range>_> *)local_e8,range,&local_c8,
            (vector<Range,_std::allocator<Range>_> *)local_a8);
  local_108._16_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_108._8_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_108._0_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_e8._0_8_;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_e8._8_8_;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_e8._16_8_;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  local_e8._16_8_ = (pointer)0x0;
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_108);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_e8);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_a8);
  local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.super__Vector_impl_data
  ._M_start = (Exclusion *)0x0;
  local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.super__Vector_impl_data
  ._M_finish = (Exclusion *)0x0;
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"exclusions.","");
  Rules::all((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88,local_60,(string *)local_108);
  if ((Range *)local_108._0_8_ != (Range *)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
  }
  if (local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pRVar6 = local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lowerCase((string *)local_108,(string *)pRVar6);
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"","");
      Rules::get((string *)local_e8,local_60,(string *)pRVar6,(string *)local_a8);
      std::vector<Exclusion,std::allocator<Exclusion>>::
      emplace_back<std::__cxx11::string,std::__cxx11::string>
                ((vector<Exclusion,std::allocator<Exclusion>> *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (string *)local_e8);
      if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
      }
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
      }
      if ((Range *)local_108._0_8_ != (Range *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      pRVar6 = (pointer)&(pRVar6->start)._seconds;
    } while (pRVar6 != local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  local_e8._0_8_ = (pointer)(local_e8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Found {1} exclusions","");
  format<unsigned_long>
            ((string *)local_108,1,(string *)local_e8,
             (long)local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5);
  debug((string *)local_108);
  if ((Range *)local_108._0_8_ != (Range *)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
  }
  if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  pEVar7 = local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_a8._16_8_ = (Range *)0x0;
  local_a8._0_8_ = (Range *)0x0;
  local_a8._8_8_ = (Range *)0x0;
  local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Range *)0x0;
  local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_start = (Range *)0x0;
  local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Range *)0x0;
  for (this = local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
              super__Vector_impl_data._M_start; this != pEVar7; this = this + 1) {
    Exclusion::tokens_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108,this);
    iVar4 = std::__cxx11::string::compare((char *)(local_108._0_8_ + 0x20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    if (iVar4 == 0) {
      bVar3 = Exclusion::additive(this);
      if (bVar3) {
        Exclusion::ranges((vector<Range,_std::allocator<Range>_> *)local_108,this,local_68);
        uVar1 = local_108._8_8_;
        for (pRVar10 = (Range *)local_108._0_8_; pRVar10 != (Range *)uVar1; pRVar10 = pRVar10 + 1) {
          if (local_a8._8_8_ == local_a8._16_8_) {
            std::vector<Range,std::allocator<Range>>::_M_realloc_insert<Range_const&>
                      ((vector<Range,std::allocator<Range>> *)local_a8,(iterator)local_a8._8_8_,
                       pRVar10);
          }
          else {
            *(_func_int ***)local_a8._8_8_ = (_func_int **)&PTR__Range_001a1778;
            pDVar8 = &pRVar10->start;
            pDVar9 = (Datetime *)(local_a8._8_8_ + 8);
            for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
              iVar4 = pDVar8->_month;
              pDVar9->_year = pDVar8->_year;
              pDVar9->_month = iVar4;
              pDVar8 = (Datetime *)((long)pDVar8 + (ulong)bVar11 * -0x10 + 8);
              pDVar9 = (Datetime *)((long)pDVar9 + (ulong)bVar11 * -0x10 + 8);
            }
            local_a8._8_8_ = local_a8._8_8_ + 0x68;
          }
        }
      }
      else {
        Exclusion::ranges((vector<Range,_std::allocator<Range>_> *)local_108,this,local_68);
        uVar1 = local_108._8_8_;
        for (pRVar10 = (Range *)local_108._0_8_; pRVar10 != (Range *)uVar1; pRVar10 = pRVar10 + 1) {
          if (local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Range,std::allocator<Range>>::_M_realloc_insert<Range_const&>
                      ((vector<Range,std::allocator<Range>> *)&local_88,
                       (iterator)
                       local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                       super__Vector_impl_data._M_finish,pRVar10);
          }
          else {
            (local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
             super__Vector_impl_data._M_finish)->_vptr_Range = (_func_int **)&PTR__Range_001a1778;
            pDVar8 = &pRVar10->start;
            pDVar9 = &(local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                       super__Vector_impl_data._M_finish)->start;
            for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
              iVar4 = pDVar8->_month;
              pDVar9->_year = pDVar8->_year;
              pDVar9->_month = iVar4;
              pDVar8 = (Datetime *)((long)pDVar8 + (ulong)bVar11 * -0x10 + 8);
              pDVar9 = (Datetime *)((long)pDVar9 + (ulong)bVar11 * -0x10 + 8);
            }
            local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      std::vector<Range,_std::allocator<Range>_>::~vector
                ((vector<Range,_std::allocator<Range>_> *)local_108);
    }
  }
  addRanges((vector<Range,_std::allocator<Range>_> *)local_e8,local_68,&local_c8,&local_88);
  local_108._16_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_108._8_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_108._0_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_e8._0_8_;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_e8._8_8_;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_e8._16_8_;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  local_e8._16_8_ = (pointer)0x0;
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_108);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_e8);
  pRVar6 = (pointer)(local_e8 + 0x10);
  if (local_a8._0_8_ != local_a8._8_8_) {
    local_e8._0_8_ = pRVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Found {1} additional working days","");
    format<unsigned_long>
              ((string *)local_108,1,(string *)local_e8,
               ((long)(local_a8._8_8_ - local_a8._0_8_) >> 3) * 0x4ec4ec4ec4ec4ec5);
    debug((string *)local_108);
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    if ((pointer)local_e8._0_8_ != pRVar6) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    }
  }
  if (local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_e8._0_8_ = pRVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Found {1} additional non-working days","");
    format<unsigned_long>
              ((string *)local_108,1,(string *)local_e8,
               ((long)local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_88.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
    debug((string *)local_108);
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    if ((pointer)local_e8._0_8_ != pRVar6) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    }
  }
  subtractRanges((vector<Range,_std::allocator<Range>_> *)local_e8,&local_c8,
                 (vector<Range,_std::allocator<Range>_> *)local_a8);
  local_108._16_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_108._8_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_108._0_8_ =
       local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_e8._0_8_;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_e8._8_8_;
  local_c8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_e8._16_8_;
  local_e8._0_8_ = (Range *)0x0;
  local_e8._8_8_ = (Range *)0x0;
  local_e8._16_8_ = (pointer)0x0;
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_108);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_e8);
  local_108._16_8_ = (Range *)0x0;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (Range *)0x0;
  local_60 = (Rules *)local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if (local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar7 = local_58.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      Exclusion::tokens_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8,pEVar7);
      iVar4 = std::__cxx11::string::compare((char *)(local_e8._0_8_ + 0x20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8);
      if (iVar4 != 0) {
        Exclusion::ranges((vector<Range,_std::allocator<Range>_> *)local_e8,pEVar7,local_68);
        uVar1 = local_e8._8_8_;
        for (pRVar10 = (Range *)local_e8._0_8_; pRVar10 != (Range *)uVar1; pRVar10 = pRVar10 + 1) {
          bVar3 = Range::is_empty(pRVar10);
          if (!bVar3) {
            if (local_108._8_8_ == local_108._16_8_) {
              std::vector<Range,std::allocator<Range>>::_M_realloc_insert<Range_const&>
                        ((vector<Range,std::allocator<Range>> *)local_108,(iterator)local_108._8_8_,
                         pRVar10);
            }
            else {
              *(_func_int ***)local_108._8_8_ = (_func_int **)&PTR__Range_001a1778;
              pDVar8 = &pRVar10->start;
              pDVar9 = (Datetime *)(local_108._8_8_ + 8);
              for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
                iVar4 = pDVar8->_month;
                pDVar9->_year = pDVar8->_year;
                pDVar9->_month = iVar4;
                pDVar8 = (Datetime *)((long)pDVar8 + (ulong)bVar11 * -0x10 + 8);
                pDVar9 = (Datetime *)((long)pDVar9 + (ulong)bVar11 * -0x10 + 8);
              }
              local_108._8_8_ = local_108._8_8_ + 0x68;
            }
          }
        }
        std::vector<Range,_std::allocator<Range>_>::~vector
                  ((vector<Range,_std::allocator<Range>_> *)local_e8);
      }
      pEVar7 = pEVar7 + 1;
    } while ((Rules *)pEVar7 != local_60);
  }
  addRanges((vector<Range,_std::allocator<Range>_> *)local_e8,local_68,&local_c8,
            (vector<Range,_std::allocator<Range>_> *)local_108);
  pvVar2 = local_38;
  merge(local_38,(vector<Range,_std::allocator<Range>_> *)local_e8);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_e8);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_108);
  std::vector<Range,_std::allocator<Range>_>::~vector(&local_88);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_a8);
  std::vector<Exclusion,_std::allocator<Exclusion>_>::~vector(&local_58);
  std::vector<Range,_std::allocator<Range>_>::~vector(&local_c8);
  return pvVar2;
}

Assistant:

std::vector <Range> getAllExclusions (
  const Rules& rules,
  const Range& range)
{
  // Start with the set of all holidays, intersected with range.
  std::vector <Range> results;
  results = addRanges (range, results, getHolidays (rules));

  // Load all exclusions from configuration.
  std::vector <Exclusion> exclusions;
  for (auto& name : rules.all ("exclusions."))
    exclusions.emplace_back (lowerCase (name), rules.get (name));
  debug (format ("Found {1} exclusions", exclusions.size ()));

  // Find exclusions 'exc day on <date>' and remove from holidays.
  // Find exclusions 'exc day off <date>' and add to holidays.
  std::vector <Range> daysOn;
  std::vector <Range> daysOff;
  for (auto& exclusion : exclusions)
  {
    if (exclusion.tokens ()[1] == "day")
    {
      if (exclusion.additive ())
        for (auto& r : exclusion.ranges (range))
          daysOn.push_back (r);
      else
        for (auto& r : exclusion.ranges (range))
          daysOff.push_back (r);
    }
  }

  // daysOff are combined with existing holidays.
  results = addRanges (range, results, daysOff);
  if (! daysOn.empty ())
    debug (format ("Found {1} additional working days", daysOn.size ()));
  if (! daysOff.empty ())
    debug (format ("Found {1} additional non-working days", daysOff.size ()));

  // daysOn are subtracted from the existing holidays.
  results = subtractRanges (results, daysOn);

  // Expand all exclusions that are not 'exc day ...' into excluded ranges that
  // overlap with range.
  std::vector <Range> exclusionRanges;
  for (auto& exclusion : exclusions)
  {
    if (exclusion.tokens ()[1] != "day")
    {
      for (auto& r : exclusion.ranges (range))
      {
        if (! r.is_empty ())
        {
          exclusionRanges.push_back (r);
        }
      }
    }
  }

  return merge (addRanges (range, results, exclusionRanges));
}